

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsession.cpp
# Opt level: O3

int __thiscall
jrtplib::RTPSession::Create
          (RTPSession *this,RTPSessionParams *sessparams,RTPTransmitter *transmitter)

{
  bool bVar1;
  bool bVar2;
  ulong uVar3;
  int iVar4;
  
  iVar4 = -0x3a;
  if (this->created == false) {
    bVar1 = sessparams->usepollthread;
    this->usingpollthread = bVar1;
    bVar2 = sessparams->m_needThreadSafety;
    this->needthreadsafety = bVar2;
    iVar4 = -0xb1;
    if ((byte)(bVar1 ^ 1U | bVar2) == 1) {
      this->useSR_BYEifpossible = sessparams->SR_BYE;
      this->sentpackets = false;
      uVar3 = sessparams->maxpacksize;
      this->maxpacksize = uVar3;
      iVar4 = -0x3d;
      if (599 < uVar3) {
        this->rtptrans = transmitter;
        iVar4 = (*(transmitter->super_RTPMemoryObject)._vptr_RTPMemoryObject[0x1e])(transmitter);
        if (-1 < iVar4) {
          this->deletetransmitter = false;
          iVar4 = InternalCreate(this,sessparams);
          return iVar4;
        }
      }
    }
  }
  return iVar4;
}

Assistant:

int RTPSession::Create(const RTPSessionParams &sessparams,RTPTransmitter *transmitter)
{
	int status;
	
	if (created)
		return ERR_RTP_SESSION_ALREADYCREATED;

	usingpollthread = sessparams.IsUsingPollThread();
	needthreadsafety = sessparams.NeedThreadSafety();
	if (usingpollthread && !needthreadsafety)
		return ERR_RTP_SESSION_THREADSAFETYCONFLICT;

	useSR_BYEifpossible = sessparams.GetSenderReportForBYE();
	sentpackets = false;
	
	// Check max packet size
	
	if ((maxpacksize = sessparams.GetMaximumPacketSize()) < RTP_MINPACKETSIZE)
		return ERR_RTP_SESSION_MAXPACKETSIZETOOSMALL;
		
	rtptrans = transmitter;

	if ((status = rtptrans->SetMaximumPacketSize(maxpacksize)) < 0)
		return status;

	deletetransmitter = false;
	return InternalCreate(sessparams);
}